

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O0

void __thiscall lr_grammar::GrammarLR::GrammarLR(GrammarLR *this,string *generate,int length)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  ulong uVar8;
  reference pvVar9;
  ostream *poVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  Express *pEVar16;
  int *piVar17;
  undefined8 uVar18;
  reference pvVar19;
  reference pvVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0 [32];
  string local_390 [8];
  string t;
  int local_370;
  int local_36c;
  int j_6;
  int i_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [32];
  int local_328;
  char local_321;
  int i_7;
  char buffer [8];
  string text;
  char local_2f8 [8];
  char formatS [5];
  int j_5;
  int m_2;
  Project tmp;
  int j_4;
  int i_6;
  int j_3;
  int i_5;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int j_2;
  int i_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [32];
  int local_258;
  int local_254;
  int m_1;
  int j_1;
  int i_3;
  string finnalyC;
  ExpressLR local_228;
  value_type local_20c;
  undefined1 local_208 [8];
  vector<int,_std::allocator<int>_> exp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [4];
  int index;
  string name;
  allocator local_1a1;
  string local_1a0 [32];
  ExpressLR local_180;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  int local_108;
  int local_104;
  int index_1;
  int m;
  vector<int,_std::allocator<int>_> exp_1;
  int local_c8;
  int local_c4;
  int j;
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result_of_name;
  int local_88;
  int i_1;
  string local_78 [32];
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  undefined1 local_38 [4];
  int i;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vectorGenrates;
  int length_local;
  string *generate_local;
  GrammarLR *this_local;
  
  vectorGenrates.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = length;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->name_of_keys);
  std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::vector
            (&this->elements);
  std::vector<int,_std::allocator<int>_>::vector(&this->finally_charIndex);
  std::vector<int,_std::allocator<int>_>::vector(&this->not_finally_charIndex);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->first);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->follow);
  std::vector<int,_std::allocator<int>_>::vector(&this->first_temp);
  std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::vector(&this->states);
  std::
  vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
  ::vector(&this->action_table);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)local_38);
  for (temp.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      temp.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
      vectorGenrates.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      temp.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           temp.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58);
    std::__cxx11::string::string
              (local_78,(string *)
                        (generate +
                        (long)temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0x20));
    public_tool::parse_productions
              ((string *)local_78,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58);
    std::__cxx11::string::~string(local_78);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_38,(value_type *)local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
  }
  for (local_88 = 0;
      local_88 <
      vectorGenrates.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_88 = local_88 + 1) {
    pvVar5 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_38,(long)local_88);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar5,0);
    std::__cxx11::string::string
              ((string *)
               &result_of_name.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar6);
    add_elem(this,(string *)
                  &result_of_name.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
    std::__cxx11::string::~string
              ((string *)
               &result_of_name.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&j);
  for (local_c4 = 0;
      local_c4 <
      vectorGenrates.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_c4 = local_c4 + 1) {
    local_c8 = 1;
    while( true ) {
      pvVar5 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_38,(long)local_c4);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar5);
      if (sVar7 <= (ulong)(long)local_c8) break;
      pvVar5 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_38,(long)local_c4);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar5,(long)local_c8);
      std::__cxx11::string::string
                ((string *)
                 &exp_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)pvVar6);
      public_tool::parse_elem
                ((string *)
                 &exp_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&j);
      std::__cxx11::string::~string
                ((string *)
                 &exp_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&index_1);
      for (local_104 = 0; uVar8 = (ulong)local_104,
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&j), uVar8 < sVar7; local_104 = local_104 + 1) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&j,(long)local_104);
        std::__cxx11::string::string(local_128,(string *)pvVar6);
        iVar4 = find_name(this,(string *)local_128);
        std::__cxx11::string::~string(local_128);
        local_108 = iVar4;
        if (iVar4 == -2) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&j,(long)local_104);
          std::__cxx11::string::string(local_148,(string *)pvVar6);
          local_108 = add_elem(this,(string *)local_148,true);
          std::__cxx11::string::~string(local_148);
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&index_1,&local_108);
      }
      pvVar5 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_38,(long)local_c4);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar5,0);
      std::__cxx11::string::string(local_168,(string *)pvVar6);
      iVar4 = find_name(this,(string *)local_168);
      pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)iVar4);
      ExpressLR::ExpressLR(&local_180,(vector<int,_std::allocator<int>_> *)&index_1);
      ElemRight::add_expression(pvVar9,&local_180);
      ExpressLR::~ExpressLR(&local_180);
      std::__cxx11::string::~string(local_168);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&index_1)
      ;
      local_c8 = local_c8 + 1;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"#",&local_1a1);
  add_elem(this,(string *)local_1a0,true);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                     (&this->elements,0);
  std::operator+(local_1c8,(char *)&(pvVar9->super_Elem).name);
  std::__cxx11::string::string
            ((string *)
             &exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(string *)local_1c8);
  iVar4 = add_elem(this,(string *)
                        &exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,false);
  std::__cxx11::string::~string
            ((string *)
             &exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_208);
  local_20c = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_208,&local_20c);
  pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                     (&this->elements,(long)iVar4);
  ExpressLR::ExpressLR(&local_228,(vector<int,_std::allocator<int>_> *)local_208);
  ElemRight::add_expression(pvVar9,&local_228);
  ExpressLR::~ExpressLR(&local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i_3,"finnaly:",(allocator *)((long)&j_1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&j_1 + 3));
  for (m_1 = 0; uVar8 = (ulong)m_1,
      sVar7 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::size
                        (&this->elements), uVar8 < sVar7; m_1 = m_1 + 1) {
    pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)m_1);
    if (((pvVar9->super_Elem).is_finally & 1U) == 0) {
      pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)m_1);
      poVar10 = std::operator<<((ostream *)&std::cout,(string *)&(pvVar9->super_Elem).name);
      std::operator<<(poVar10,"->");
      local_254 = 0;
      while( true ) {
        uVar8 = (ulong)local_254;
        pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)m_1);
        sVar7 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::size
                          (&pvVar9->expression_of_set);
        if (sVar7 <= uVar8) break;
        local_258 = 0;
        while( true ) {
          uVar8 = (ulong)local_258;
          pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                   operator[](&this->elements,(long)m_1);
          pvVar11 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                    operator[](&pvVar9->expression_of_set,(long)local_254);
          sVar7 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)pvVar11);
          if (sVar7 <= uVar8) break;
          pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                   operator[](&this->elements,(long)m_1);
          pvVar11 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                    operator[](&pvVar9->expression_of_set,(long)local_254);
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)pvVar11,(long)local_258);
          if (*pvVar12 == -1) {
            std::operator<<((ostream *)&std::cout,"@");
          }
          else {
            pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                     operator[](&this->elements,(long)m_1);
            pvVar11 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                      operator[](&pvVar9->expression_of_set,(long)local_254);
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)pvVar11,(long)local_258);
            pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                     operator[](&this->elements,(long)*pvVar12);
            std::operator<<((ostream *)&std::cout,(string *)&(pvVar9->super_Elem).name);
          }
          local_258 = local_258 + 1;
        }
        std::operator<<((ostream *)&std::cout," | ");
        local_254 = local_254 + 1;
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_2,
                     (char *)&i_3);
      std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                (&this->elements,(long)m_1);
      std::operator+(local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_2);
      std::__cxx11::string::operator=((string *)&i_3,(string *)local_278);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::~string((string *)&j_2);
    }
  }
  poVar10 = std::operator<<((ostream *)&std::cout,(string *)&i_3);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  get_tow_char_index(this);
  create_first_set(this);
  for (local_29c = 0; uVar8 = (ulong)local_29c,
      sVar7 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::size
                        (&this->elements), uVar8 < sVar7; local_29c = local_29c + 1) {
    poVar10 = std::operator<<((ostream *)&std::cout,"first[");
    pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)local_29c);
    poVar10 = std::operator<<(poVar10,(string *)&(pvVar9->super_Elem).name);
    std::operator<<(poVar10,"]={");
    local_2a0 = 0;
    while( true ) {
      uVar8 = (ulong)local_2a0;
      pvVar13 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->first,(long)local_29c);
      sVar7 = std::vector<int,_std::allocator<int>_>::size(pvVar13);
      if (sVar7 <= uVar8) break;
      pvVar13 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->first,(long)local_29c);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar13,(long)local_2a0);
      if (*pvVar12 == -1) {
        std::operator<<((ostream *)&std::cout,"@ ");
      }
      else {
        pvVar13 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->first,(long)local_29c);
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar13,(long)local_2a0);
        pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)*pvVar12);
        poVar10 = std::operator<<((ostream *)&std::cout,(string *)&(pvVar9->super_Elem).name);
        std::operator<<(poVar10," ");
      }
      local_2a0 = local_2a0 + 1;
    }
    std::operator<<((ostream *)&std::cout,"}\n");
  }
  pvVar13 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&this->follow,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i_5,"#",(allocator *)((long)&j_3 + 3));
  local_2a4 = find_name(this,(string *)&i_5);
  std::vector<int,_std::allocator<int>_>::push_back(pvVar13,&local_2a4);
  std::__cxx11::string::~string((string *)&i_5);
  std::allocator<char>::~allocator((allocator<char> *)((long)&j_3 + 3));
  create_follow_set(this);
  for (i_6 = 0; sVar7 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                        size(&this->elements), (ulong)(long)i_6 < sVar7; i_6 = i_6 + 1) {
    pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)i_6);
    if (((pvVar9->super_Elem).is_finally & 1U) == 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"follow[");
      pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)i_6);
      poVar10 = std::operator<<(poVar10,(string *)&(pvVar9->super_Elem).name);
      std::operator<<(poVar10,"]={");
      j_4 = 0;
      while( true ) {
        pvVar13 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->follow,(long)i_6);
        sVar7 = std::vector<int,_std::allocator<int>_>::size(pvVar13);
        if (sVar7 <= (ulong)(long)j_4) break;
        pvVar13 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->follow,(long)i_6);
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar13,(long)j_4);
        if (*pvVar12 == -1) {
          std::operator<<((ostream *)&std::cout,"@ ");
        }
        else {
          pvVar13 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&this->follow,(long)i_6);
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar13,(long)j_4);
          pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                   operator[](&this->elements,(long)*pvVar12);
          poVar10 = std::operator<<((ostream *)&std::cout,(string *)&(pvVar9->super_Elem).name);
          std::operator<<(poVar10," ");
        }
        j_4 = j_4 + 1;
      }
      std::operator<<((ostream *)&std::cout,"}\n");
    }
  }
  create_dfa_states(this);
  for (tmp.projectPoint = 0;
      sVar7 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::size
                        (&this->states), (ulong)(long)tmp.projectPoint < sVar7;
      tmp.projectPoint = tmp.projectPoint + 1) {
    tmp.expressIndex = 0;
    while( true ) {
      pvVar14 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::operator[]
                          (&this->states,(long)tmp.projectPoint);
      sVar7 = std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::size
                        (&pvVar14->projects);
      if (sVar7 <= (ulong)(long)tmp.expressIndex) break;
      pvVar14 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::operator[]
                          (&this->states,(long)tmp.projectPoint);
      pvVar15 = std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::operator[]
                          (&pvVar14->projects,(long)tmp.expressIndex);
      iVar4 = pvVar15->projectPoint;
      uVar1 = pvVar15->elemKey;
      uVar2 = pvVar15->expressIndex;
      pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)(int)uVar1);
      poVar10 = std::operator<<((ostream *)&std::cout,(string *)&(pvVar9->super_Elem).name);
      std::operator<<(poVar10,"->");
      stack0xfffffffffffffd14 = 0;
      while( true ) {
        uVar8 = (ulong)stack0xfffffffffffffd14;
        pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)(int)uVar1);
        pvVar11 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                  operator[](&pvVar9->expression_of_set,(long)(int)uVar2);
        sVar7 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)pvVar11);
        if (sVar7 <= uVar8) break;
        pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)(int)uVar1);
        pEVar16 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                   operator[](&pvVar9->expression_of_set,(long)(int)uVar2)->super_Express;
        piVar17 = base_grammar::Express::operator[](pEVar16,stack0xfffffffffffffd14);
        if (*piVar17 == -1) {
          std::operator<<((ostream *)&std::cout,"@");
        }
        else {
          pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                   operator[](&this->elements,(long)(int)uVar1);
          pEVar16 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                     operator[](&pvVar9->expression_of_set,(long)(int)uVar2)->super_Express;
          piVar17 = base_grammar::Express::operator[](pEVar16,stack0xfffffffffffffd14);
          pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                   operator[](&this->elements,(long)*piVar17);
          std::operator<<((ostream *)&std::cout,(string *)&(pvVar9->super_Elem).name);
        }
        register0x00000000 = stack0xfffffffffffffd14 + 1;
      }
      poVar10 = std::operator<<((ostream *)&std::cout,"  ProjectPoint:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar4);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      tmp.expressIndex = tmp.expressIndex + 1;
    }
    formatS[0] = '\0';
    formatS[1] = '\0';
    formatS[2] = '\0';
    formatS[3] = '\0';
    for (; uVar3 = formatS._0_4_,
        pvVar14 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
                  operator[](&this->states,(long)tmp.projectPoint),
        (int)uVar3 < pvVar14->elementCount; formatS._0_4_ = formatS._0_4_ + 1) {
      pvVar14 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::operator[]
                          (&this->states,(long)tmp.projectPoint);
      if (pvVar14->next[(int)formatS._0_4_] != -1) {
        pvVar9 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)(int)formatS._0_4_);
        poVar10 = std::operator<<((ostream *)&std::cout,(string *)&(pvVar9->super_Elem).name);
        poVar10 = std::operator<<(poVar10,"--");
        pvVar14 = std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
                  operator[](&this->states,(long)tmp.projectPoint);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar14->next[(int)formatS._0_4_]);
        std::operator<<(poVar10,"  ");
      }
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  create_action_table(this);
  builtin_strncpy(local_2f8,"%+7s",5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(buffer + 1),"",(allocator *)buffer);
  std::allocator<char>::~allocator((allocator<char> *)buffer);
  for (local_328 = 0; uVar8 = (ulong)local_328,
      sVar7 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::size
                        (&this->elements), uVar8 < sVar7; local_328 = local_328 + 1) {
    std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
              (&this->elements,(long)local_328);
    uVar18 = std::__cxx11::string::c_str();
    sprintf(&local_321,local_2f8,uVar18);
    std::operator+(local_348,buffer + 1);
    std::__cxx11::string::operator=((string *)(buffer + 1),(string *)local_348);
    std::__cxx11::string::~string((string *)local_348);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_6,
                 buffer + 1);
  std::__cxx11::string::operator=((string *)(buffer + 1),(string *)&j_6);
  std::__cxx11::string::~string((string *)&j_6);
  for (local_36c = 0;
      sVar7 = std::
              vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
              ::size(&this->action_table), (ulong)(long)local_36c < sVar7; local_36c = local_36c + 1
      ) {
    local_370 = 0;
    while( true ) {
      pvVar19 = std::
                vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                ::operator[](&this->action_table,(long)local_36c);
      sVar7 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::size(pvVar19);
      if (sVar7 <= (ulong)(long)local_370) break;
      std::__cxx11::string::string(local_390);
      pvVar19 = std::
                vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                ::operator[](&this->action_table,(long)local_36c);
      pvVar20 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                          (pvVar19,(long)local_370);
      switch(pvVar20->type) {
      case SMOVE:
        std::__cxx11::string::operator=(local_390,"SMOVE");
        break;
      case REDUCE:
        std::__cxx11::string::operator=(local_390,"REDUCE");
        break;
      case ERROR:
        std::__cxx11::string::operator=(local_390," ");
        break;
      case ACC:
        std::__cxx11::string::operator=(local_390,"ACC");
      }
      uVar18 = std::__cxx11::string::c_str();
      sprintf(&local_321,local_2f8,uVar18);
      std::operator+(local_3b0,buffer + 1);
      std::__cxx11::string::operator=((string *)(buffer + 1),(string *)local_3b0);
      std::__cxx11::string::~string((string *)local_3b0);
      std::__cxx11::string::~string(local_390);
      local_370 = local_370 + 1;
    }
    std::operator+(local_3d0,buffer + 1);
    std::__cxx11::string::operator=((string *)(buffer + 1),(string *)local_3d0);
    std::__cxx11::string::~string((string *)local_3d0);
  }
  std::operator<<((ostream *)&std::cout,(string *)(buffer + 1));
  std::__cxx11::string::~string((string *)(buffer + 1));
  std::__cxx11::string::~string((string *)&i_3);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_208);
  std::__cxx11::string::~string((string *)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&j);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)local_38);
  return;
}

Assistant:

GrammarLR::GrammarLR(string* generate, int length){

    //1.解析所有字符串
    vector<vector<string>> vectorGenrates;//这个是用来存放各个表达式

    //解析各个表达式,第一个是非终结符号，后面的是产生式
    for (int i = 0; i < length; i++){
        vector<string> temp;
        parse_productions(generate[i], temp);
        vectorGenrates.push_back(temp);
    }



    //2.添加非终结符添加到find表中,开始的非终结符就是length个
    for (int i = 0; i < length; i++){
        add_elem(vectorGenrates[i][0], false);
    }

    //3.一个个解析产生式,会添加到find表中
    vector<string> result_of_name;
    for (int i = 0; i < length; i++){

        //ElemLeft N_F_E = elements[find_name(vectorGenrates[i][0])];//非终结符，接下来要对这个终结符进行exp的添加

        //对genrates[i]进行分析；
        for (int j = 1; j < vectorGenrates[i].size(); j++){
            parse_elem(vectorGenrates[i][j], result_of_name);
            vector<int> exp;
            for (int m = 0; m < result_of_name.size(); m++){
                int index = find_name(result_of_name[m]);
                if (index == -2){
                    index = add_elem(result_of_name[m], true);
                }
                exp.push_back(index);

            }
            elements[find_name(vectorGenrates[i][0])].add_expression(ExpressLR(exp));
        }
    }

    add_elem("#", true);
    //添加拓广文法
    string name = elements[0].name + "'";
    int index = this->add_elem(name, false);
    vector<int> exp;
    exp.push_back(0);
    elements[index].add_expression(exp);

    //查看输入是不正确
    //测试一下：
    string finnalyC = "finnaly:";
    for (int i = 0; i < elements.size(); i++){
        if (!elements[i].is_finally){
            cout << elements[i].name << "->";
            for (int j = 0; j < elements[i].expression_of_set.size(); j++){
                for (int m = 0; m < elements[i].expression_of_set[j].expression.size(); m++){
                    if (elements[i].expression_of_set[j].expression[m] != -1){
                        cout << elements[elements[i].expression_of_set[j].expression[m]].name;
                    }
                    else
                    {
                        cout << "@";
                    }
                }
                cout << " | ";
            }
            cout << endl;
        }
        else
        {
            finnalyC = finnalyC + " " + elements[i].name;
        }
    }
    cout << finnalyC << endl;

    //6.两表生成（在5的时候就不会再添加新的符号了）
    //同时在这里初始化一下First和Follw表
    get_tow_char_index();

    //7.求first集合
    this->create_first_set();

    //检查一下，first集合
    for (int i = 0; i < elements.size(); i++){
        cout << "first[" << elements[i].name << "]={";
        for (int j = 0; j < first[i].size(); j++){
            if (first[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[first[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }

    //8.求follow集合
    //将#送到开始符号
    this->follow[0].push_back(find_name("#"));
    this->create_follow_set();


    for (int i = 0; i < elements.size(); i++){

        if (elements[i].is_finally) continue;

        cout << "follow[" << elements[i].name << "]={";
        for (int j = 0; j < follow[i].size(); j++){
            if (follow[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[follow[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }


    //生成DFA状态表
    this->create_dfa_states();

    //检测DFA
    for (int i = 0; i < this->states.size(); i++){

        for (int j = 0; j < states[i].projects.size(); j++){

            Project tmp = states[i].projects[j];
            cout << elements[tmp.elemKey].name << "->";
            for (int m = 0; m < elements[tmp.elemKey].expression_of_set[tmp.expressIndex].expression.size(); m++){

                if (elements[tmp.elemKey].expression_of_set[tmp.expressIndex][m] != -1){
                    cout << elements[elements[tmp.elemKey].expression_of_set[tmp.expressIndex][m]].name;
                }
                else
                {
                    cout << "@";
                }


            }
            cout << "  ProjectPoint:"<<tmp.projectPoint<<endl;

        }
        for (int j = 0; j < states[i].elementCount; j++){

            if (states[i].next[j] != -1){

                cout << elements[j].name << "--" << states[i].next[j] << "  ";
            }

        }
        cout << endl;

    }

    //创建指导动作的表
    this->create_action_table();

    //将表打印出来
    char formatS[] = "%+7s";//栈的格式
    string text="";
    char buffer[8];
    for (int i = 0; i < elements.size(); i++){
        sprintf(buffer, formatS, elements[i].name.c_str());
        text = text + buffer;
    }
    text = text + "\n";
    for (int i = 0; i < action_table.size(); i++){

        for (int j = 0; j < action_table[i].size(); j++){
            string t;
            switch (action_table[i][j].type)
            {
                case ERROR:
                    t = " ";
                    break;
                case REDUCE:
                    t = "REDUCE";
                    break;
                case SMOVE:
                    t = "SMOVE";
                    break;
                case ACC:
                    t = "ACC";
                    break;
                default:
                    break;
            }
            sprintf(buffer, formatS,t.c_str());
            text = text + buffer;
        }
        text = text + "\n";
    }
    cout << text;
}